

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_finish(nk_context *ctx,nk_window *win)

{
  nk_panel *pnVar1;
  void *pvVar2;
  nk_size nVar3;
  nk_size nVar4;
  void *memory;
  nk_command *last;
  nk_command *sublast;
  nk_command *parent_last;
  nk_popup_buffer *buf;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3f3c,"void nk_finish(struct nk_context *, struct nk_window *)");
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3f3d,"void nk_finish(struct nk_context *, struct nk_window *)");
  }
  if (((ctx != (nk_context *)0x0) && (win != (nk_window *)0x0)) &&
     (nk_finish_buffer(ctx,&win->buffer), (win->layout->popup_buffer).active != 0)) {
    pnVar1 = win->layout;
    pvVar2 = (ctx->memory).memory.ptr;
    nVar3 = (pnVar1->popup_buffer).last;
    nVar4 = (win->buffer).last;
    *(nk_size *)((long)pvVar2 + (pnVar1->popup_buffer).parent + 8) = (pnVar1->popup_buffer).end;
    *(undefined8 *)((long)pvVar2 + nVar3 + 8) = *(undefined8 *)((long)pvVar2 + nVar4 + 8);
    *(nk_size *)((long)pvVar2 + nVar4 + 8) = (pnVar1->popup_buffer).begin;
    (win->buffer).last = (pnVar1->popup_buffer).last;
    (win->buffer).end = (pnVar1->popup_buffer).end;
    (pnVar1->popup_buffer).active = 0;
  }
  return;
}

Assistant:

NK_INTERN void
nk_finish(struct nk_context *ctx, struct nk_window *win)
{
    struct nk_popup_buffer *buf;
    struct nk_command *parent_last;
    struct nk_command *sublast;
    struct nk_command *last;
    void *memory;

    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!ctx || !win) return;
    nk_finish_buffer(ctx, &win->buffer);
    if (!win->layout->popup_buffer.active) return;

    /* from here on is for popup window buffer handling */
    /*--------------------------------------------------*/
    buf = &win->layout->popup_buffer;
    memory = ctx->memory.memory.ptr;

    /* redirect the sub-window buffer to the end of the window command buffer */
    parent_last = nk_ptr_add(struct nk_command, memory, buf->parent);
    sublast = nk_ptr_add(struct nk_command, memory, buf->last);
    last = nk_ptr_add(struct nk_command, memory, win->buffer.last);

    parent_last->next = buf->end;
    sublast->next = last->next;
    last->next = buf->begin;
    win->buffer.last = buf->last;
    win->buffer.end = buf->end;
    buf->active = nk_false;
}